

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O2

void StartCall(void)

{
  datatype dVar1;
  
  dVar1 = data_class(oldtabindex);
  if (dVar1 == dtprocedure) {
    actionpush(oldtabindex);
    nextarg = oldtabindex;
    return;
  }
  error("Cannot call - this is not a procedure",linenum);
}

Assistant:

void	StartCall(void)
{
    if (data_class(oldtabindex) != dtprocedure)
        error("Cannot call - this is not a procedure", linenum);
    actionpush(oldtabindex);
    nextarg = oldtabindex;
    
}